

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

string * Path::join(string *__return_storage_ptr__,string *base,string *path)

{
  bool bVar1;
  long lVar2;
  size_type sVar3;
  pointer pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  _Alloc_hider local_20;
  
  sVar3 = base->_M_string_length;
  if (sVar3 != 0) {
    if (path->_M_string_length == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = (base->_M_dataplus)._M_p;
      goto LAB_00157d72;
    }
    bVar1 = is_abspath(path);
    if (!bVar1) {
      lVar2 = std::__cxx11::string::rfind((char)base,0x2f);
      local_20._M_p = "/";
      if (lVar2 == base->_M_string_length - 1) {
        local_20._M_p = "";
      }
      Util::join<std::__cxx11::string_const&,char_const*,std::__cxx11::string_const&>
                (__return_storage_ptr__,(Util *)base,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20,
                 (char **)path,in_R8);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar4 = (path->_M_dataplus)._M_p;
  sVar3 = path->_M_string_length;
LAB_00157d72:
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar4,pcVar4 + sVar3);
  return __return_storage_ptr__;
}

Assistant:

string join(const string &base, const string &path)
{
	if (base.empty())
		return path;
	if (path.empty())
		return base;

	if (is_abspath(path))
		return path;

	auto index = find_last_slash(base);
	bool need_slash = index != base.size() - 1;
	return Util::join(base, need_slash ? "/" : "", path);
}